

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O0

void __thiscall D5xNvmFlash::writePage(D5xNvmFlash *this,uint32_t page)

{
  uint16_t uVar1;
  uint32_t dstAddr;
  FlashPageError *this_00;
  uint32_t local_44;
  uint32_t addr;
  uint32_t page_local;
  D5xNvmFlash *this_local;
  
  if ((this->super_Flash)._pages <= page) {
    this_00 = (FlashPageError *)__cxa_allocate_exception(8);
    FlashPageError::FlashPageError(this_00);
    __cxa_throw(this_00,&FlashPageError::typeinfo,FlashPageError::~FlashPageError);
  }
  uVar1 = readRegU16(this,'\0');
  writeRegU16(this,'\0',uVar1 & 0xffcf | 0xc000);
  if ((((this->super_Flash).field_0xf4 & 1) != 0) && ((page & 0xf) == 0)) {
    erase(this,page * (this->super_Flash)._size,(this->super_Flash)._size << 4);
  }
  command(this,'\x15');
  dstAddr = (this->super_Flash)._addr + page * (this->super_Flash)._size;
  WordCopyApplet::setDstAddr(&(this->super_Flash)._wordCopy,dstAddr);
  if (((this->super_Flash)._onBufferA & 1U) == 0) {
    local_44 = (this->super_Flash)._pageBufferB;
  }
  else {
    local_44 = (this->super_Flash)._pageBufferA;
  }
  WordCopyApplet::setSrcAddr(&(this->super_Flash)._wordCopy,local_44);
  WordCopyApplet::setWords(&(this->super_Flash)._wordCopy,(this->super_Flash)._size >> 2);
  (this->super_Flash)._onBufferA = (bool)(((this->super_Flash)._onBufferA ^ 0xffU) & 1);
  waitReady(this);
  Applet::runv(&(this->super_Flash)._wordCopy.super_Applet);
  writeRegU32(this,'\x14',dstAddr);
  command(this,'\x03');
  return;
}

Assistant:

void
D5xNvmFlash::writePage(uint32_t page)
{
    if (page >= _pages)
    {
        throw FlashPageError();
    }

    // Configure manual page write and disable caches
    writeRegU16(NVM_REG_CTRLA, (readRegU16(NVM_REG_CTRLA) | (0x3 << 14)) & 0xffcf);

    // Auto-erase if writing at the start of the erase page
    if (_eraseAuto && page % ERASE_BLOCK_PAGES == 0)
    {
        erase(page * _size, ERASE_BLOCK_PAGES * _size);
    }

    // Clear page bur
    command(NVM_CMD_PBC);

    uint32_t addr = _addr + (page * _size );

    _wordCopy.setDstAddr(addr);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _wordCopy.setWords(_size / sizeof(uint32_t));
    _onBufferA = !_onBufferA;
    waitReady();
    _wordCopy.runv();

    writeRegU32(NVM_REG_ADDR, addr);
    command(NVM_CMD_WP);
}